

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O0

double util::rpn_eval_not(vector<double,_std::allocator<double>_> *args)

{
  int iVar1;
  reference pvVar2;
  undefined8 local_18;
  vector<double,_std::allocator<double>_> *args_local;
  
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](args,0);
  iVar1 = d2i(*pvVar2);
  local_18 = 1.0;
  if (iVar1 != 0) {
    local_18 = 0.0;
  }
  return local_18;
}

Assistant:

static double rpn_eval_not(std::vector<double> args)   { return !d2i(args[0]); }